

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.cpp
# Opt level: O0

int __thiscall xmrig::HttpContext::close(HttpContext *this,int __fd)

{
  bool bVar1;
  int iVar2;
  uv_handle_t *puVar3;
  _func_void_uv_handle_t_ptr *p_Var4;
  iterator it;
  map<unsigned_long,_xmrig::HttpContext_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_xmrig::HttpContext_*>_>_>
  *in_stack_ffffffffffffffa8;
  map<unsigned_long,_xmrig::HttpContext_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_xmrig::HttpContext_*>_>_>
  *in_stack_ffffffffffffffb0;
  __0 local_39;
  _Base_ptr local_38;
  _Base_ptr local_30;
  _Self local_28;
  uint64_t local_20;
  _Self local_18;
  int local_c;
  HttpContext *local_8;
  
  local_c = __fd;
  local_8 = this;
  if ((__fd < 0) && (this->m_listener != (IHttpListener *)0x0)) {
    (this->super_HttpData).status = __fd;
    (*this->m_listener->_vptr_IHttpListener[2])(this->m_listener,&this->super_HttpData);
  }
  local_20 = HttpData::id(&this->super_HttpData);
  local_18._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_xmrig::HttpContext_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_xmrig::HttpContext_*>_>_>
       ::find(in_stack_ffffffffffffffa8,(key_type *)0x1e640e);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<unsigned_long,_xmrig::HttpContext_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_xmrig::HttpContext_*>_>_>
       ::end(in_stack_ffffffffffffffa8);
  bVar1 = std::operator!=(&local_18,&local_28);
  if (bVar1) {
    local_30 = local_18._M_node;
    local_38 = (_Base_ptr)
               std::
               map<unsigned_long,xmrig::HttpContext*,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,xmrig::HttpContext*>>>
               ::erase_abi_cxx11_(in_stack_ffffffffffffffb0,(iterator)this);
  }
  puVar3 = handle(this);
  iVar2 = uv_is_closing(puVar3);
  if (iVar2 == 0) {
    puVar3 = handle(this);
    p_Var4 = close(int)::$_0::operator_cast_to_function_pointer(&local_39);
    iVar2 = uv_close(puVar3,p_Var4);
  }
  return iVar2;
}

Assistant:

void xmrig::HttpContext::close(int status)
{
    if (status < 0 && m_listener) {
        this->status = status;
        m_listener->onHttpData(*this);
    }

    auto it = storage.find(id());
    if (it != storage.end()) {
        storage.erase(it);
    }

    if (!uv_is_closing(handle())) {
        uv_close(handle(), [](uv_handle_t *handle) -> void { delete reinterpret_cast<HttpContext*>(handle->data); });
    }
}